

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

int ui32fromtoken(Context_conflict2 *ctx,uint32 *_val)

{
  uint32 uVar1;
  int local_30;
  uint32 local_2c;
  uint32 mult;
  uint32 val;
  uint len;
  uint i;
  uint32 *_val_local;
  Context_conflict2 *ctx_local;
  
  for (val = 0; ((uVar1 = val, val < ctx->tokenlen && ('/' < ctx->token[val])) &&
                (ctx->token[val] < ':')); val = val + 1) {
  }
  if (val == 0) {
    *_val = 0;
    ctx_local._4_4_ = 0;
  }
  else {
    local_2c = 0;
    local_30 = 1;
    while (val != 0) {
      local_2c = (ctx->token[val - 1] + -0x30) * local_30 + local_2c;
      local_30 = local_30 * 10;
      val = val - 1;
    }
    ctx->token = ctx->token + uVar1;
    ctx->tokenlen = ctx->tokenlen - uVar1;
    *_val = local_2c;
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

static int ui32fromtoken(Context *ctx, uint32 *_val)
{
    unsigned int i;
    for (i = 0; i < ctx->tokenlen; i++)
    {
        if ((ctx->token[i] < '0') || (ctx->token[i] > '9'))
            break;
    } // for

    if (i == 0)
    {
        *_val = 0;
        return 0;
    } // if

    const unsigned int len = i;
    uint32 val = 0;
    uint32 mult = 1;
    while (i--)
    {
        val += ((uint32) (ctx->token[i] - '0')) * mult;
        mult *= 10;
    } // while

    ctx->token += len;
    ctx->tokenlen -= len;

    *_val = val;
    return 1;
}